

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O0

void mdct_backward(mdct_lookup *init,float *in,float *out)

{
  float fVar1;
  int points;
  int iVar2;
  float *pfVar3;
  float *local_60;
  float *iX_1;
  float *oX2;
  float *oX1;
  float *T;
  float *oX;
  float *iX;
  int n4;
  int n2;
  int n;
  float *out_local;
  float *in_local;
  mdct_lookup *init_local;
  
  points = init->n >> 1;
  iVar2 = init->n >> 2;
  oX = in + (long)points + -7;
  oX1 = init->trig + iVar2;
  T = out + (long)points + (long)iVar2;
  do {
    T[-4] = -oX[2] * oX1[3] + -(*oX * oX1[2]);
    T[-3] = *oX * oX1[3] + -(oX[2] * oX1[2]);
    T[-2] = -oX[6] * oX1[1] + -(oX[4] * *oX1);
    T[-1] = oX[4] * oX1[1] + -(oX[6] * *oX1);
    oX = oX + -8;
    oX1 = oX1 + 4;
    T = T + -4;
  } while (in <= oX);
  oX = in + (long)points + -8;
  T = out + (long)points + (long)iVar2;
  oX1 = init->trig + iVar2;
  do {
    pfVar3 = oX1 + -4;
    *T = oX[4] * oX1[-1] + oX[6] * oX1[-2];
    T[1] = oX[4] * oX1[-2] + -(oX[6] * oX1[-1]);
    T[2] = *oX * oX1[-3] + oX[2] * *pfVar3;
    T[3] = *oX * *pfVar3 + -(oX[2] * oX1[-3]);
    oX = oX + -8;
    T = T + 4;
    oX1 = pfVar3;
  } while (in <= oX);
  mdct_butterflies(init,out + points,points);
  mdct_bitreverse(init,out);
  iX_1 = out + (long)points + (long)iVar2;
  oX1 = init->trig + points;
  local_60 = out;
  oX2 = out + (long)points + (long)iVar2;
  do {
    pfVar3 = oX2 + -4;
    oX2[-1] = *local_60 * oX1[1] + -(local_60[1] * *oX1);
    *iX_1 = -(*local_60 * *oX1 + local_60[1] * oX1[1]);
    oX2[-2] = local_60[2] * oX1[3] + -(local_60[3] * oX1[2]);
    iX_1[1] = -(local_60[2] * oX1[2] + local_60[3] * oX1[3]);
    oX2[-3] = local_60[4] * oX1[5] + -(local_60[5] * oX1[4]);
    iX_1[2] = -(local_60[4] * oX1[4] + local_60[5] * oX1[5]);
    *pfVar3 = local_60[6] * oX1[7] + -(local_60[7] * oX1[6]);
    iX_1[3] = -(local_60[6] * oX1[6] + local_60[7] * oX1[7]);
    iX_1 = iX_1 + 4;
    local_60 = local_60 + 8;
    oX1 = oX1 + 8;
    oX2 = pfVar3;
  } while (local_60 < pfVar3);
  iX_1 = out + iVar2;
  local_60 = out + (long)points + (long)iVar2;
  oX2 = iX_1;
  do {
    pfVar3 = local_60 + -4;
    fVar1 = local_60[-1];
    oX2[-1] = fVar1;
    *iX_1 = -fVar1;
    fVar1 = local_60[-2];
    oX2[-2] = fVar1;
    iX_1[1] = -fVar1;
    fVar1 = local_60[-3];
    oX2[-3] = fVar1;
    iX_1[2] = -fVar1;
    fVar1 = *pfVar3;
    oX2[-4] = fVar1;
    iX_1[3] = -fVar1;
    iX_1 = iX_1 + 4;
    local_60 = pfVar3;
    oX2 = oX2 + -4;
  } while (iX_1 < pfVar3);
  local_60 = out + (long)points + (long)iVar2;
  oX2 = out + (long)points + (long)iVar2;
  do {
    pfVar3 = oX2 + -4;
    *pfVar3 = local_60[3];
    oX2[-3] = local_60[2];
    oX2[-2] = local_60[1];
    oX2[-1] = *local_60;
    local_60 = local_60 + 4;
    oX2 = pfVar3;
  } while (out + points < pfVar3);
  return;
}

Assistant:

void mdct_backward(mdct_lookup *init, DATA_TYPE *in, DATA_TYPE *out){
  int n=init->n;
  int n2=n>>1;
  int n4=n>>2;

  /* rotate */

  DATA_TYPE *iX = in+n2-7;
  DATA_TYPE *oX = out+n2+n4;
  DATA_TYPE *T  = init->trig+n4;

  do{
    oX         -= 4;
    oX[0]       = MULT_NORM(-iX[2] * T[3] - iX[0]  * T[2]);
    oX[1]       = MULT_NORM (iX[0] * T[3] - iX[2]  * T[2]);
    oX[2]       = MULT_NORM(-iX[6] * T[1] - iX[4]  * T[0]);
    oX[3]       = MULT_NORM (iX[4] * T[1] - iX[6]  * T[0]);
    iX         -= 8;
    T          += 4;
  }while(iX>=in);

  iX            = in+n2-8;
  oX            = out+n2+n4;
  T             = init->trig+n4;

  do{
    T          -= 4;
    oX[0]       =  MULT_NORM (iX[4] * T[3] + iX[6] * T[2]);
    oX[1]       =  MULT_NORM (iX[4] * T[2] - iX[6] * T[3]);
    oX[2]       =  MULT_NORM (iX[0] * T[1] + iX[2] * T[0]);
    oX[3]       =  MULT_NORM (iX[0] * T[0] - iX[2] * T[1]);
    iX         -= 8;
    oX         += 4;
  }while(iX>=in);

  mdct_butterflies(init,out+n2,n2);
  mdct_bitreverse(init,out);

  /* roatate + window */

  {
    DATA_TYPE *oX1=out+n2+n4;
    DATA_TYPE *oX2=out+n2+n4;
    DATA_TYPE *iX =out;
    T             =init->trig+n2;

    do{
      oX1-=4;

      oX1[3]  =  MULT_NORM (iX[0] * T[1] - iX[1] * T[0]);
      oX2[0]  = -MULT_NORM (iX[0] * T[0] + iX[1] * T[1]);

      oX1[2]  =  MULT_NORM (iX[2] * T[3] - iX[3] * T[2]);
      oX2[1]  = -MULT_NORM (iX[2] * T[2] + iX[3] * T[3]);

      oX1[1]  =  MULT_NORM (iX[4] * T[5] - iX[5] * T[4]);
      oX2[2]  = -MULT_NORM (iX[4] * T[4] + iX[5] * T[5]);

      oX1[0]  =  MULT_NORM (iX[6] * T[7] - iX[7] * T[6]);
      oX2[3]  = -MULT_NORM (iX[6] * T[6] + iX[7] * T[7]);

      oX2+=4;
      iX    +=   8;
      T     +=   8;
    }while(iX<oX1);

    iX=out+n2+n4;
    oX1=out+n4;
    oX2=oX1;

    do{
      oX1-=4;
      iX-=4;

      oX2[0] = -(oX1[3] = iX[3]);
      oX2[1] = -(oX1[2] = iX[2]);
      oX2[2] = -(oX1[1] = iX[1]);
      oX2[3] = -(oX1[0] = iX[0]);

      oX2+=4;
    }while(oX2<iX);

    iX=out+n2+n4;
    oX1=out+n2+n4;
    oX2=out+n2;
    do{
      oX1-=4;
      oX1[0]= iX[3];
      oX1[1]= iX[2];
      oX1[2]= iX[1];
      oX1[3]= iX[0];
      iX+=4;
    }while(oX1>oX2);
  }
}